

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_string_range(jit_State *J,RecordFFData *rd)

{
  RecordFFData *pRVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  TRef TVar4;
  TRef TVar5;
  int k;
  long lVar6;
  TRef tmp;
  TRef trslen_1;
  ptrdiff_t len;
  ptrdiff_t i;
  TRef trslen;
  TRef trptr;
  int32_t end;
  int32_t start;
  GCstr *str;
  TRef local_138;
  TRef trend;
  TRef trstart;
  TRef tr0;
  TRef trlen;
  TRef trstr;
  RecordFFData *rd_local;
  jit_State *J_local;
  RecordFFData *local_110;
  undefined2 local_106;
  undefined2 local_104;
  undefined2 local_102;
  RecordFFData *local_100;
  undefined2 local_f6;
  undefined2 local_f4;
  undefined2 local_f2;
  RecordFFData *local_f0;
  undefined2 local_e6;
  undefined2 local_e4;
  undefined2 local_e2;
  RecordFFData *local_e0;
  undefined2 local_d6;
  undefined2 local_d4;
  undefined2 local_d2;
  RecordFFData *local_d0;
  undefined2 local_c6;
  undefined2 local_c4;
  undefined2 local_c2;
  RecordFFData *local_c0;
  undefined2 local_b6;
  undefined2 local_b4;
  undefined2 local_b2;
  RecordFFData *local_b0;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  RecordFFData *local_a0;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  RecordFFData *local_90;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  RecordFFData *local_80;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  RecordFFData *local_70;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  RecordFFData *local_60;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  RecordFFData *local_50;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  RecordFFData *local_40;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  RecordFFData *local_30;
  undefined2 local_26;
  undefined2 local_24;
  undefined2 local_22;
  RecordFFData *local_20;
  undefined2 local_16;
  undefined2 local_14;
  undefined2 local_12;
  RecordFFData *local_10;
  
  _trlen = rd;
  rd_local = (RecordFFData *)J;
  tr0 = lj_ir_tostr(J,*J->base);
  local_10 = rd_local;
  local_12 = 0x4513;
  local_14 = (undefined2)tr0;
  local_16 = 0;
  *(undefined2 *)&rd_local[7].field_0x14 = 0x4513;
  *(undefined2 *)&rd_local[7].data = local_14;
  *(undefined2 *)((long)&rd_local[7].data + 2) = 0;
  trstart = lj_opt_fold((jit_State *)rd_local);
  trend = lj_ir_kint((jit_State *)rd_local,0);
  _end = argv2str((jit_State *)rd_local,_trlen->argv);
  if (_trlen->data == 0) {
    if ((*(uint *)(*(long *)&rd_local[6].data + 4) & 0x1f000000) == 0) {
      trptr = 1;
      local_138 = lj_ir_kint((jit_State *)rd_local,1);
    }
    else {
      trptr = argv2int((jit_State *)rd_local,_trlen->argv + 1);
      local_138 = lj_opt_narrow_toint((jit_State *)rd_local,
                                      *(TRef *)(*(long *)&rd_local[6].data + 4));
    }
    if ((*(int *)(*(long *)&rd_local[6].data + 4) == 0) ||
       ((*(uint *)(*(long *)&rd_local[6].data + 8) & 0x1f000000) == 0)) {
      str._4_4_ = local_138;
      trslen = trptr;
    }
    else {
      str._4_4_ = lj_opt_narrow_toint((jit_State *)rd_local,
                                      *(TRef *)(*(long *)&rd_local[6].data + 8));
      trslen = argv2int((jit_State *)rd_local,_trlen->argv + 2);
    }
  }
  else {
    trptr = argv2int((jit_State *)rd_local,_trlen->argv + 1);
    local_138 = lj_opt_narrow_toint((jit_State *)rd_local,*(TRef *)(*(long *)&rd_local[6].data + 4))
    ;
    str._4_4_ = *(uint *)(*(long *)&rd_local[6].data + 8);
    if ((str._4_4_ & 0x1f000000) == 0) {
      str._4_4_ = lj_ir_kint((jit_State *)rd_local,-1);
      trslen = 0xffffffff;
    }
    else {
      str._4_4_ = lj_opt_narrow_toint((jit_State *)rd_local,str._4_4_);
      trslen = argv2int((jit_State *)rd_local,_trlen->argv + 2);
    }
  }
  uVar3 = (undefined2)str._4_4_;
  if ((int)trslen < 0) {
    local_20 = rd_local;
    local_22 = 0x93;
    local_26 = (undefined2)trend;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x93;
    *(undefined2 *)&rd_local[7].data = uVar3;
    *(undefined2 *)((long)&rd_local[7].data + 2) = local_26;
    local_24 = uVar3;
    lj_opt_fold((jit_State *)rd_local);
    pRVar1 = rd_local;
    local_34 = (undefined2)trstart;
    local_30 = rd_local;
    local_32 = 0x2913;
    local_36 = (undefined2)str._4_4_;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x2913;
    *(undefined2 *)&rd_local[7].data = local_34;
    *(undefined2 *)((long)&rd_local[7].data + 2) = local_36;
    TVar4 = lj_opt_fold((jit_State *)rd_local);
    TVar5 = lj_ir_kint((jit_State *)rd_local,1);
    local_40 = pRVar1;
    local_42 = 0x2913;
    local_46 = (undefined2)TVar5;
    *(undefined2 *)&pRVar1[7].field_0x14 = 0x2913;
    *(short *)&pRVar1[7].data = (short)TVar4;
    *(undefined2 *)((long)&pRVar1[7].data + 2) = local_46;
    local_44 = (short)TVar4;
    str._4_4_ = lj_opt_fold((jit_State *)rd_local);
    trslen = trslen + _end->len + 1;
  }
  else {
    uVar2 = (undefined2)trstart;
    if (_end->len < trslen) {
      local_60 = rd_local;
      local_62 = 0x793;
      *(undefined2 *)&rd_local[7].field_0x14 = 0x793;
      *(undefined2 *)&rd_local[7].data = uVar3;
      *(undefined2 *)((long)&rd_local[7].data + 2) = uVar2;
      local_66 = uVar2;
      local_64 = uVar3;
      lj_opt_fold((jit_State *)rd_local);
      trslen = _end->len;
      str._4_4_ = trstart;
    }
    else {
      local_50 = rd_local;
      local_52 = 0x693;
      *(undefined2 *)&rd_local[7].field_0x14 = 0x693;
      *(undefined2 *)&rd_local[7].data = uVar3;
      *(undefined2 *)((long)&rd_local[7].data + 2) = uVar2;
      local_56 = uVar2;
      local_54 = uVar3;
      lj_opt_fold((jit_State *)rd_local);
    }
  }
  local_138 = recff_string_start((jit_State *)rd_local,_end,(int32_t *)&trptr,local_138,trstart,
                                 trend);
  J_local._4_2_ = (undefined2)str._4_4_;
  J_local._2_2_ = (undefined2)local_138;
  if (_trlen->data == 0) {
    k = trslen - trptr;
    lVar6 = (long)k;
    if (lVar6 < 1) {
      local_110 = rd_local;
      J_local._6_2_ = 0x293;
      *(undefined2 *)&rd_local[7].field_0x14 = 0x293;
      *(undefined2 *)&rd_local[7].data = J_local._4_2_;
      *(undefined2 *)((long)&rd_local[7].data + 2) = J_local._2_2_;
      lj_opt_fold((jit_State *)rd_local);
      _trlen->nres = 0;
    }
    else {
      local_c0 = rd_local;
      local_c2 = 0x2a13;
      *(undefined2 *)&rd_local[7].field_0x14 = 0x2a13;
      *(undefined2 *)&rd_local[7].data = J_local._4_2_;
      *(undefined2 *)((long)&rd_local[7].data + 2) = J_local._2_2_;
      local_c6 = J_local._2_2_;
      local_c4 = J_local._4_2_;
      TVar4 = lj_opt_fold((jit_State *)rd_local);
      pRVar1 = rd_local;
      TVar5 = lj_ir_kint((jit_State *)rd_local,k);
      local_d0 = pRVar1;
      local_d2 = 0x893;
      local_d6 = (undefined2)TVar5;
      *(undefined2 *)&pRVar1[7].field_0x14 = 0x893;
      *(short *)&pRVar1[7].data = (short)TVar4;
      *(undefined2 *)((long)&pRVar1[7].data + 2) = local_d6;
      local_d4 = (short)TVar4;
      lj_opt_fold((jit_State *)rd_local);
      if (0xfa < (long)((ulong)(uint)rd_local[7].nres + lVar6)) {
        lj_trace_err_info((jit_State *)rd_local,LJ_TRERR_STACKOV);
      }
      _trlen->nres = lVar6;
      for (len = 0; pRVar1 = rd_local, len < lVar6; len = len + 1) {
        uVar3 = (undefined2)local_138;
        TVar4 = lj_ir_kint((jit_State *)rd_local,(int32_t)len);
        local_e0 = pRVar1;
        local_e2 = 0x2913;
        local_e6 = (undefined2)TVar4;
        *(undefined2 *)&pRVar1[7].field_0x14 = 0x2913;
        *(undefined2 *)&pRVar1[7].data = uVar3;
        *(undefined2 *)((long)&pRVar1[7].data + 2) = local_e6;
        local_e4 = uVar3;
        TVar4 = lj_opt_fold((jit_State *)rd_local);
        local_f4 = (undefined2)tr0;
        local_f0 = rd_local;
        local_f2 = 0x4009;
        local_f6 = (undefined2)TVar4;
        *(undefined2 *)&rd_local[7].field_0x14 = 0x4009;
        *(undefined2 *)&rd_local[7].data = local_f4;
        *(undefined2 *)((long)&rd_local[7].data + 2) = local_f6;
        TVar4 = lj_opt_fold((jit_State *)rd_local);
        local_100 = rd_local;
        local_102 = 0x4610;
        local_104 = (undefined2)TVar4;
        local_106 = 1;
        *(undefined2 *)&rd_local[7].field_0x14 = 0x4610;
        *(undefined2 *)&rd_local[7].data = local_104;
        *(undefined2 *)((long)&rd_local[7].data + 2) = 1;
        TVar4 = lj_opt_fold((jit_State *)rd_local);
        *(TRef *)(*(long *)&rd_local[6].data + len * 4) = TVar4;
      }
    }
  }
  else if ((int)(trslen - trptr) < 0) {
    local_b0 = rd_local;
    local_b2 = 0x93;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x93;
    *(undefined2 *)&rd_local[7].data = J_local._4_2_;
    *(undefined2 *)((long)&rd_local[7].data + 2) = J_local._2_2_;
    local_b6 = J_local._2_2_;
    local_b4 = J_local._4_2_;
    lj_opt_fold((jit_State *)rd_local);
    TVar4 = lj_ir_kgc((jit_State *)rd_local,(GCobj *)&rd_local[-0x1a].nres,IRT_STR);
    **(TRef **)&rd_local[6].data = TVar4;
  }
  else {
    local_70 = rd_local;
    local_72 = 0x2a13;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x2a13;
    *(undefined2 *)&rd_local[7].data = J_local._4_2_;
    *(undefined2 *)((long)&rd_local[7].data + 2) = J_local._2_2_;
    local_76 = J_local._2_2_;
    local_74 = J_local._4_2_;
    TVar4 = lj_opt_fold((jit_State *)rd_local);
    uVar3 = (undefined2)TVar4;
    local_80 = rd_local;
    local_82 = 0x193;
    local_86 = (undefined2)trend;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x193;
    *(undefined2 *)&rd_local[7].data = uVar3;
    *(undefined2 *)((long)&rd_local[7].data + 2) = local_86;
    local_84 = uVar3;
    lj_opt_fold((jit_State *)rd_local);
    local_94 = (undefined2)tr0;
    local_90 = rd_local;
    local_92 = 0x4009;
    local_96 = (undefined2)local_138;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x4009;
    *(undefined2 *)&rd_local[7].data = local_94;
    *(undefined2 *)((long)&rd_local[7].data + 2) = local_96;
    TVar4 = lj_opt_fold((jit_State *)rd_local);
    local_a4 = (undefined2)TVar4;
    local_a0 = rd_local;
    local_a2 = 0x4f04;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x4f04;
    *(undefined2 *)&rd_local[7].data = local_a4;
    *(undefined2 *)((long)&rd_local[7].data + 2) = uVar3;
    local_a6 = uVar3;
    TVar4 = lj_opt_fold((jit_State *)rd_local);
    **(TRef **)&rd_local[6].data = TVar4;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_range(jit_State *J, RecordFFData *rd)
{
  TRef trstr = lj_ir_tostr(J, J->base[0]);
  TRef trlen = emitir(IRTI(IR_FLOAD), trstr, IRFL_STR_LEN);
  TRef tr0 = lj_ir_kint(J, 0);
  TRef trstart, trend;
  GCstr *str = argv2str(J, &rd->argv[0]);
  int32_t start, end;
  if (rd->data) {  /* string.sub(str, start [,end]) */
    start = argv2int(J, &rd->argv[1]);
    trstart = lj_opt_narrow_toint(J, J->base[1]);
    trend = J->base[2];
    if (tref_isnil(trend)) {
      trend = lj_ir_kint(J, -1);
      end = -1;
    } else {
      trend = lj_opt_narrow_toint(J, trend);
      end = argv2int(J, &rd->argv[2]);
    }
  } else {  /* string.byte(str, [,start [,end]]) */
    if (tref_isnil(J->base[1])) {
      start = 1;
      trstart = lj_ir_kint(J, 1);
    } else {
      start = argv2int(J, &rd->argv[1]);
      trstart = lj_opt_narrow_toint(J, J->base[1]);
    }
    if (J->base[1] && !tref_isnil(J->base[2])) {
      trend = lj_opt_narrow_toint(J, J->base[2]);
      end = argv2int(J, &rd->argv[2]);
    } else {
      trend = trstart;
      end = start;
    }
  }
  if (end < 0) {
    emitir(IRTGI(IR_LT), trend, tr0);
    trend = emitir(IRTI(IR_ADD), emitir(IRTI(IR_ADD), trlen, trend),
		   lj_ir_kint(J, 1));
    end = end+(int32_t)str->len+1;
  } else if ((MSize)end <= str->len) {
    emitir(IRTGI(IR_ULE), trend, trlen);
  } else {
    emitir(IRTGI(IR_UGT), trend, trlen);
    end = (int32_t)str->len;
    trend = trlen;
  }
  trstart = recff_string_start(J, str, &start, trstart, trlen, tr0);
  if (rd->data) {  /* Return string.sub result. */
    if (end - start >= 0) {
      /* Also handle empty range here, to avoid extra traces. */
      TRef trptr, trslen = emitir(IRTI(IR_SUB), trend, trstart);
      emitir(IRTGI(IR_GE), trslen, tr0);
      trptr = emitir(IRT(IR_STRREF, IRT_PGC), trstr, trstart);
      J->base[0] = emitir(IRT(IR_SNEW, IRT_STR), trptr, trslen);
    } else {  /* Range underflow: return empty string. */
      emitir(IRTGI(IR_LT), trend, trstart);
      J->base[0] = lj_ir_kstr(J, &J2G(J)->strempty);
    }
  } else {  /* Return string.byte result(s). */
    ptrdiff_t i, len = end - start;
    if (len > 0) {
      TRef trslen = emitir(IRTI(IR_SUB), trend, trstart);
      emitir(IRTGI(IR_EQ), trslen, lj_ir_kint(J, (int32_t)len));
      if (J->baseslot + len > LJ_MAX_JSLOTS)
	lj_trace_err_info(J, LJ_TRERR_STACKOV);
      rd->nres = len;
      for (i = 0; i < len; i++) {
	TRef tmp = emitir(IRTI(IR_ADD), trstart, lj_ir_kint(J, (int32_t)i));
	tmp = emitir(IRT(IR_STRREF, IRT_PGC), trstr, tmp);
	J->base[i] = emitir(IRT(IR_XLOAD, IRT_U8), tmp, IRXLOAD_READONLY);
      }
    } else {  /* Empty range or range underflow: return no results. */
      emitir(IRTGI(IR_LE), trend, trstart);
      rd->nres = 0;
    }
  }
}